

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpaintengine_raster.cpp
# Opt level: O3

shared_ptr<const_QGradientCache::CacheInfo> __thiscall
QGradientCache::addCacheElement
          (QGradientCache *this,quint64 hash_val,QGradient *gradient,int opacity)

{
  byte bVar1;
  Span *pSVar2;
  Chain *pCVar3;
  const_iterator it;
  uint uVar4;
  InterpolationMode IVar5;
  uint uVar6;
  Data<QHashPrivate::MultiNode<unsigned_long_long,_std::shared_ptr<const_QGradientCache::CacheInfo>_>_>
  *d;
  void *pvVar7;
  ulong uVar8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var9;
  undefined4 in_register_0000000c;
  QGradient *this_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var10;
  uchar *puVar11;
  long lVar12;
  int in_R8D;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var13;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp;
  size_t sVar14;
  long in_FS_OFFSET;
  shared_ptr<const_QGradientCache::CacheInfo> sVar15;
  shared_ptr<const_QGradientCache::CacheInfo> local_88;
  iterator local_78;
  Data<QHashPrivate::MultiNode<unsigned_long_long,_std::shared_ptr<const_QGradientCache::CacheInfo>_>_>
  *local_58;
  size_t sStack_50;
  uchar *local_48;
  QGradient *local_40;
  long local_38;
  
  this_00 = (QGradient *)CONCAT44(in_register_0000000c,opacity);
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (*(long *)(hash_val + 8) != 0x3c) goto LAB_003c5298;
  d = *(Data<QHashPrivate::MultiNode<unsigned_long_long,_std::shared_ptr<const_QGradientCache::CacheInfo>_>_>
        **)hash_val;
  if (d == (Data<QHashPrivate::MultiNode<unsigned_long_long,_std::shared_ptr<const_QGradientCache::CacheInfo>_>_>
            *)0x0) {
    sVar14 = 0;
LAB_003c5193:
    d = (Data<QHashPrivate::MultiNode<unsigned_long_long,_std::shared_ptr<const_QGradientCache::CacheInfo>_>_>
         *)0x0;
    puVar11 = (uchar *)0x0;
  }
  else {
    if (1 < (uint)(d->ref).atomic._q_value.super___atomic_base<int>._M_i) {
      d = QHashPrivate::
          Data<QHashPrivate::MultiNode<unsigned_long_long,_std::shared_ptr<const_QGradientCache::CacheInfo>_>_>
          ::detached(d);
      *(Data<QHashPrivate::MultiNode<unsigned_long_long,_std::shared_ptr<const_QGradientCache::CacheInfo>_>_>
        **)hash_val = d;
    }
    pSVar2 = d->spans;
    if (pSVar2->offsets[0] == 0xff) {
      puVar11 = (uchar *)0x0;
      uVar8 = 1;
      do {
        sVar14 = uVar8;
        if (d->numBuckets == sVar14) {
          d = (Data<QHashPrivate::MultiNode<unsigned_long_long,_std::shared_ptr<const_QGradientCache::CacheInfo>_>_>
               *)0x0;
          sVar14 = 0;
          goto LAB_003c51dc;
        }
        uVar8 = sVar14 + 1;
      } while (pSVar2[sVar14 >> 7].offsets[(uint)sVar14 & 0x7f] == 0xff);
      if (d == (Data<QHashPrivate::MultiNode<unsigned_long_long,_std::shared_ptr<const_QGradientCache::CacheInfo>_>_>
                *)0x0) goto LAB_003c5193;
    }
    else {
      sVar14 = 0;
    }
    puVar11 = pSVar2[sVar14 >> 7].entries[pSVar2[sVar14 >> 7].offsets[(uint)sVar14 & 0x7f]].storage.
              data + 8;
  }
LAB_003c51dc:
  pvVar7 = (void *)QRandomGenerator64::global();
  uVar4 = QRandomGenerator::_fillRange(pvVar7,0);
  if (0x4444444 < (ulong)uVar4) {
    uVar8 = (ulong)uVar4 * 0x3c >> 0x20;
    do {
      if (*(long *)(*(long *)puVar11 + 0x10) == 0) {
        do {
          if (d->numBuckets - 1 == sVar14) {
            sVar14 = 0;
            puVar11 = (uchar *)0x0;
            d = (Data<QHashPrivate::MultiNode<unsigned_long_long,_std::shared_ptr<const_QGradientCache::CacheInfo>_>_>
                 *)0x0;
            goto LAB_003c5264;
          }
          sVar14 = sVar14 + 1;
          bVar1 = d->spans[sVar14 >> 7].offsets[(uint)sVar14 & 0x7f];
        } while (bVar1 == 0xff);
        puVar11 = d->spans[sVar14 >> 7].entries[bVar1].storage.data + 8;
      }
      else {
        puVar11 = (uchar *)(*(long *)puVar11 + 0x10);
      }
LAB_003c5264:
      uVar8 = uVar8 - 1;
    } while (uVar8 != 0);
  }
  it.i.bucket = sVar14;
  it.i.d = d;
  it.e = (Chain **)puVar11;
  local_58 = d;
  sStack_50 = sVar14;
  local_48 = puVar11;
  QMultiHash<unsigned_long_long,_std::shared_ptr<const_QGradientCache::CacheInfo>_>::erase
            (&local_78,
             (QMultiHash<unsigned_long_long,_std::shared_ptr<const_QGradientCache::CacheInfo>_> *)
             hash_val,it);
LAB_003c5298:
  QGradient::stops((QGradientStops *)&local_78,this_00);
  IVar5 = QGradient::interpolationMode(this_00);
  p_Var9 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x3030);
  p_Var9->_M_use_count = 1;
  p_Var9->_M_weak_count = 1;
  p_Var9->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_007da288;
  p_Var9[0x301]._vptr__Sp_counted_base = (_func_int **)local_78.i.d;
  p_Var9[0x301]._M_use_count = (undefined4)local_78.i.bucket;
  p_Var9[0x301]._M_weak_count = local_78.i.bucket._4_4_;
  p_Var9[0x302]._vptr__Sp_counted_base = (_func_int **)local_78.e;
  p_Var9[0x302]._M_use_count = in_R8D;
  p_Var9[0x302]._M_weak_count = IVar5;
  generateGradientColorTable
            ((QGradientCache *)hash_val,this_00,(QRgba64 *)(p_Var9 + 1),0x400,in_R8D);
  p_Var13 = p_Var9 + 0x201;
  lVar12 = 0x10;
  do {
    uVar6 = QRgba64::toArgb32((QRgba64 *)((long)&p_Var9->_vptr__Sp_counted_base + lVar12));
    *(uint *)&p_Var13->_vptr__Sp_counted_base = uVar6;
    p_Var13 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
              ((long)&p_Var13->_vptr__Sp_counted_base + 4);
    lVar12 = lVar12 + 8;
  } while (lVar12 != 0x2010);
  local_88.super___shared_ptr<const_QGradientCache::CacheInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)(p_Var9 + 1);
  local_88.super___shared_ptr<const_QGradientCache::CacheInfo,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = p_Var9;
  local_40 = gradient;
  QMultiHash<unsigned_long_long,std::shared_ptr<QGradientCache::CacheInfo_const>>::
  emplace<std::shared_ptr<QGradientCache::CacheInfo_const>const&>
            (&local_78,(void *)hash_val,(unsigned_long_long *)&local_40,&local_88);
  pCVar3 = *local_78.e;
  (this->cache).d =
       (Data *)(pCVar3->value).
               super___shared_ptr<const_QGradientCache::CacheInfo,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr;
  p_Var13 = (pCVar3->value).
            super___shared_ptr<const_QGradientCache::CacheInfo,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi;
  (this->cache).m_size = (qsizetype)p_Var13;
  if (p_Var13 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var13->_M_use_count = p_Var13->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var13->_M_use_count = p_Var13->_M_use_count + 1;
    }
  }
  _Var10._M_pi = extraout_RDX;
  if (local_88.super___shared_ptr<const_QGradientCache::CacheInfo,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_88.
               super___shared_ptr<const_QGradientCache::CacheInfo,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
    _Var10._M_pi = extraout_RDX_00;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  sVar15.super___shared_ptr<const_QGradientCache::CacheInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = _Var10._M_pi;
  sVar15.super___shared_ptr<const_QGradientCache::CacheInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<const_QGradientCache::CacheInfo>)
         sVar15.super___shared_ptr<const_QGradientCache::CacheInfo,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<const CacheInfo> addCacheElement(quint64 hash_val, const QGradient &gradient, int opacity) {
        if (cache.size() == maxCacheSize()) {
            // may remove more than 1, but OK
            cache.erase(std::next(cache.begin(), QRandomGenerator::global()->bounded(maxCacheSize())));
        }
        auto cache_entry = std::make_shared<CacheInfo>(gradient.stops(), opacity, gradient.interpolationMode());
        generateGradientColorTable(gradient, cache_entry->buffer64, paletteSize(), opacity);
        for (int i = 0; i < GRADIENT_STOPTABLE_SIZE; ++i)
            cache_entry->buffer32[i] = cache_entry->buffer64[i].toArgb32();
        return cache.insert(hash_val, std::move(cache_entry)).value();
    }